

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O0

Aig_Man_t * Fra_OneHotCreateExdc(Fra_Man_t *p,Vec_Int_t *vOneHots)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int n;
  int iVar4;
  Aig_Man_t *p_00;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  int nTruePis;
  int Out2;
  int Out1;
  int i;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pObj2;
  Aig_Obj_t *pObj1;
  Aig_Man_t *pNew;
  Vec_Int_t *vOneHots_local;
  Fra_Man_t *p_local;
  
  iVar1 = Vec_IntSize(vOneHots);
  p_00 = Aig_ManStart(iVar1 / 2);
  for (Out2 = 0; iVar1 = Vec_PtrSize(p->pManAig->vCis), Out2 < iVar1; Out2 = Out2 + 1) {
    Vec_PtrEntry(p->pManAig->vCis,Out2);
    Aig_ObjCreateCi(p_00);
  }
  iVar1 = Aig_ManCiNum(p->pManAig);
  iVar2 = Aig_ManRegNum(p->pManAig);
  for (Out2 = 0; iVar3 = Vec_IntSize(vOneHots), Out2 < iVar3; Out2 = Out2 + 2) {
    iVar3 = Vec_IntEntry(vOneHots,Out2);
    n = Vec_IntEntry(vOneHots,Out2 + 1);
    if ((iVar3 != 0) || (n != 0)) {
      iVar4 = Fra_LitReg(iVar3);
      pAVar5 = Aig_ManCi(p_00,(iVar1 - iVar2) + iVar4);
      iVar4 = Fra_LitReg(n);
      pAVar6 = Aig_ManCi(p_00,(iVar1 - iVar2) + iVar4);
      iVar3 = Fra_LitSign(iVar3);
      pAVar5 = Aig_NotCond(pAVar5,iVar3);
      iVar3 = Fra_LitSign(n);
      pAVar6 = Aig_NotCond(pAVar6,iVar3);
      pAVar5 = Aig_Or(p_00,pAVar5,pAVar6);
      Aig_ObjCreateCo(p_00,pAVar5);
    }
  }
  Aig_ManCleanup(p_00);
  return p_00;
}

Assistant:

Aig_Man_t * Fra_OneHotCreateExdc( Fra_Man_t * p, Vec_Int_t * vOneHots )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj1, * pObj2, * pObj;
    int i, Out1, Out2, nTruePis;
    pNew = Aig_ManStart( Vec_IntSize(vOneHots)/2 );
//    for ( i = 0; i < Aig_ManRegNum(p->pManAig); i++ )
//        Aig_ObjCreateCi(pNew);
    Aig_ManForEachCi( p->pManAig, pObj, i )
        Aig_ObjCreateCi(pNew);
    nTruePis = Aig_ManCiNum(p->pManAig) - Aig_ManRegNum(p->pManAig);
    for ( i = 0; i < Vec_IntSize(vOneHots); i += 2 )
    {
        Out1 = Vec_IntEntry( vOneHots, i );
        Out2 = Vec_IntEntry( vOneHots, i+1 );
        if ( Out1 == 0 && Out2 == 0 )
            continue;
        pObj1 = Aig_ManCi( pNew, nTruePis + Fra_LitReg(Out1) );
        pObj2 = Aig_ManCi( pNew, nTruePis + Fra_LitReg(Out2) );
        pObj1 = Aig_NotCond( pObj1, Fra_LitSign(Out1) );
        pObj2 = Aig_NotCond( pObj2, Fra_LitSign(Out2) );
        pObj  = Aig_Or( pNew, pObj1, pObj2 );
        Aig_ObjCreateCo( pNew, pObj );
    }
    Aig_ManCleanup(pNew);
//    printf( "Created AIG with %d nodes and %d outputs.\n", Aig_ManNodeNum(pNew), Aig_ManCoNum(pNew) );
    return pNew;
}